

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

void cleanupvarinfo(rnnvarinfo *vi)

{
  rnnvarset *__ptr;
  long lVar1;
  
  free(vi->prefix);
  free(vi->prefixstr);
  free(vi->varsetstr);
  free(vi->variantsstr);
  for (lVar1 = 0; lVar1 < vi->varsetsnum; lVar1 = lVar1 + 1) {
    __ptr = vi->varsets[lVar1];
    free(__ptr->variants);
    free(__ptr);
  }
  free(vi->varsets);
  return;
}

Assistant:

static void cleanupvarinfo(struct rnnvarinfo *vi) {
	free(vi->prefix);
	free(vi->prefixstr);
	free(vi->varsetstr);
	free(vi->variantsstr);

	int i;
	for (i = 0; i < vi->varsetsnum; i++)
		freevarset(vi->varsets[i]);
	free(vi->varsets);
}